

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.c
# Opt level: O2

TestSuite * assertion_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("assertion_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0x135);
  add_test_(pTVar1,"integer_one_should_assert_true",
            &CgreenSpec__default__integer_one_should_assert_true__);
  add_test_(pTVar1,"integer_two_should_assert_true",
            &CgreenSpec__default__integer_two_should_assert_true__);
  add_test_(pTVar1,"integer_zero_should_assert_false",
            &CgreenSpec__default__integer_zero_should_assert_false__);
  add_test_(pTVar1,"one_should_assert_equal_to_one",
            &CgreenSpec__default__one_should_assert_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_long_equal_to_one",
            &CgreenSpec__default__one_should_assert_long_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_long_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_long_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_unsigned_long_equal_to_one",
            &CgreenSpec__default__one_should_assert_unsigned_long_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_unsigned_long_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_unsigned_long_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_long_long_equal_to_one",
            &CgreenSpec__default__one_should_assert_long_long_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_long_long_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_long_long_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_unsigned_long_long_equal_to_one",
            &CgreenSpec__default__one_should_assert_unsigned_long_long_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_unsigned_long_long_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_unsigned_long_long_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_short_equal_to_one",
            &CgreenSpec__default__one_should_assert_short_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_short_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_short_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_unsigned_short_equal_to_one",
            &CgreenSpec__default__one_should_assert_unsigned_short_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_unsigned_short_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_unsigned_short_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_char_equal_to_one",
            &CgreenSpec__default__one_should_assert_char_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_char_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_char_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_unsigned_char_equal_to_one",
            &CgreenSpec__default__one_should_assert_unsigned_char_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_unsigned_char_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_unsigned_char_not_equal_to_one__);
  add_test_(pTVar1,"different_pointers_with_different_contents_should_not_assert_equal",
            &
            CgreenSpec__default__different_pointers_with_different_contents_should_not_assert_equal__
           );
  add_test_(pTVar1,"different_pointers_with_same_contents_should_assert_equal",
            &CgreenSpec__default__different_pointers_with_same_contents_should_assert_equal__);
  add_test_(pTVar1,"one_should_assert_float_equal_to_one",
            &CgreenSpec__default__one_should_assert_float_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_float_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_float_not_equal_to_one__);
  add_test_(pTVar1,"one_should_assert_double_equal_to_one",
            &CgreenSpec__default__one_should_assert_double_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_double_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_double_not_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_double_equal_to_zero",
            &CgreenSpec__default__zero_should_assert_double_equal_to_zero__);
  add_test_(pTVar1,"one_should_assert_long_double_equal_to_one",
            &CgreenSpec__default__one_should_assert_long_double_equal_to_one__);
  add_test_(pTVar1,"zero_should_assert_long_double_not_equal_to_one",
            &CgreenSpec__default__zero_should_assert_long_double_not_equal_to_one__);
  add_test_(pTVar1,"double_differences_do_not_matter_past_significant_figures",
            &CgreenSpec__default__double_differences_do_not_matter_past_significant_figures__);
  add_test_(pTVar1,"can_check_equality_of_negative_floating_point_numbers",
            &CgreenSpec__default__can_check_equality_of_negative_floating_point_numbers__);
  add_test_(pTVar1,"double_one_is_less_than_two",&CgreenSpec__default__double_one_is_less_than_two__
           );
  add_test_(pTVar1,"double_one_is_greater_than_zero",
            &CgreenSpec__default__double_one_is_greater_than_zero__);
  add_test_(pTVar1,"double_can_compare_negative_numbers",
            &CgreenSpec__default__double_can_compare_negative_numbers__);
  add_test_(pTVar1,"double_differences_matter_past_significant_figures",
            &CgreenSpec__default__double_differences_matter_past_significant_figures__);
  add_test_(pTVar1,"double_assertions_can_have_custom_messages",
            &CgreenSpec__default__double_assertions_can_have_custom_messages__);
  add_test_(pTVar1,"identical_string_copies_should_match",
            &CgreenSpec__default__identical_string_copies_should_match__);
  add_test_(pTVar1,"case_different_strings_should_not_match",
            &CgreenSpec__default__case_different_strings_should_not_match__);
  add_test_(pTVar1,"identical_strings_contain_eachother",
            &CgreenSpec__default__identical_strings_contain_eachother__);
  add_test_(pTVar1,"null_string_should_only_match_another_null_string",
            &CgreenSpec__default__null_string_should_only_match_another_null_string__);
  add_test_(pTVar1,"null_string_should_only_match_another_null_string_even_with_messages",
            &
            CgreenSpec__default__null_string_should_only_match_another_null_string_even_with_messages__
           );
  add_test_(pTVar1,"inspecting_contents_of_expected_value_of_null_produces_nice_error_message",
            &
            CgreenSpec__default__inspecting_contents_of_expected_value_of_null_produces_nice_error_message__
           );
  add_test_(pTVar1,"inspecting_contents_of_actual_value_of_null_produces_nice_error_message",
            &
            CgreenSpec__default__inspecting_contents_of_actual_value_of_null_produces_nice_error_message__
           );
  add_test_(pTVar1,"inspecting_contents_of_with_zero_size_produces_nice_error_message",
            &
            CgreenSpec__default__inspecting_contents_of_with_zero_size_produces_nice_error_message__
           );
  add_test_(pTVar1,"fail_reports_message",&CgreenSpec__default__fail_reports_message__);
  add_test_(pTVar1,"return_value_constraints_are_not_allowed",
            &CgreenSpec__default__return_value_constraints_are_not_allowed__);
  return pTVar1;
}

Assistant:

TestSuite *assertion_tests(void) {
    TestSuite *suite = create_test_suite();
    add_test(suite, integer_one_should_assert_true);
    add_test(suite, integer_two_should_assert_true);
    add_test(suite, integer_zero_should_assert_false);
    add_test(suite, one_should_assert_equal_to_one);
    add_test(suite, zero_should_assert_not_equal_to_one);
    add_test(suite, one_should_assert_long_equal_to_one);
    add_test(suite, zero_should_assert_long_not_equal_to_one);
    add_test(suite, one_should_assert_unsigned_long_equal_to_one);
    add_test(suite, zero_should_assert_unsigned_long_not_equal_to_one);
    add_test(suite, one_should_assert_long_long_equal_to_one);
    add_test(suite, zero_should_assert_long_long_not_equal_to_one);
    add_test(suite, one_should_assert_unsigned_long_long_equal_to_one);
    add_test(suite, zero_should_assert_unsigned_long_long_not_equal_to_one);
    add_test(suite, one_should_assert_short_equal_to_one);
    add_test(suite, zero_should_assert_short_not_equal_to_one);
    add_test(suite, one_should_assert_unsigned_short_equal_to_one);
    add_test(suite, zero_should_assert_unsigned_short_not_equal_to_one);
    add_test(suite, one_should_assert_char_equal_to_one);
    add_test(suite, zero_should_assert_char_not_equal_to_one);
    add_test(suite, one_should_assert_unsigned_char_equal_to_one);
    add_test(suite, zero_should_assert_unsigned_char_not_equal_to_one);
    add_test(suite, different_pointers_with_different_contents_should_not_assert_equal);
    add_test(suite, different_pointers_with_same_contents_should_assert_equal);
    add_test(suite, one_should_assert_float_equal_to_one);
    add_test(suite, zero_should_assert_float_not_equal_to_one);
    add_test(suite, one_should_assert_double_equal_to_one);
    add_test(suite, zero_should_assert_double_not_equal_to_one);
    add_test(suite, zero_should_assert_double_equal_to_zero);
    add_test(suite, one_should_assert_long_double_equal_to_one);
    add_test(suite, zero_should_assert_long_double_not_equal_to_one);
    add_test(suite, double_differences_do_not_matter_past_significant_figures);
    add_test(suite, can_check_equality_of_negative_floating_point_numbers);
    add_test(suite, double_one_is_less_than_two);
    add_test(suite, double_one_is_greater_than_zero);
    add_test(suite, double_can_compare_negative_numbers);
    add_test(suite, double_differences_matter_past_significant_figures);
    add_test(suite, double_assertions_can_have_custom_messages);
    add_test(suite, identical_string_copies_should_match);
    add_test(suite, case_different_strings_should_not_match);
    add_test(suite, identical_strings_contain_eachother);
    add_test(suite, null_string_should_only_match_another_null_string);
    add_test(suite, null_string_should_only_match_another_null_string_even_with_messages);
    add_test(suite, inspecting_contents_of_expected_value_of_null_produces_nice_error_message);
    add_test(suite, inspecting_contents_of_actual_value_of_null_produces_nice_error_message);
    add_test(suite, inspecting_contents_of_with_zero_size_produces_nice_error_message);
    add_test(suite, fail_reports_message);
    add_test(suite, return_value_constraints_are_not_allowed);
    return suite;
}